

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffoptplt(fitsfile *fptr,char *tempname,int *status)

{
  int iVar1;
  fitsfile *tptr;
  int nkeys;
  int tstatus;
  int nadd;
  char card [81];
  fitsfile *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  long local_88;
  undefined6 uStack_80;
  undefined2 uStack_7a;
  undefined6 uStack_78;
  char acStack_72 [3];
  int iStack_6f;
  char cStack_6b;
  
  local_90 = 0;
  iVar1 = *status;
  if ((tempname != (char *)0x0 && iVar1 < 1) && (*tempname != '\0')) {
    ffopen(&local_a0,tempname,0,&local_90);
    if (local_90 == 0) {
      ffmahd(local_a0,1,(int *)0x0,status);
      iVar1 = *status;
      if (iVar1 < 1) {
        do {
          ffghsp(local_a0,&local_94,&local_8c,status);
          if (0 < local_94) {
            iVar1 = 0;
            do {
              iVar1 = iVar1 + 1;
              ffgrec(local_a0,iVar1,(char *)&local_88,status);
              if ((local_88 == 0x2020544e554f4350) && (cStack_6b != '0' || iStack_6f != 0x20202020))
              {
                uStack_78 = 0x202020202020;
                acStack_72[0] = ' ';
                acStack_72[1] = ' ';
                acStack_72[2] = ' ';
                iStack_6f._0_1_ = ' ';
                iStack_6f._1_1_ = ' ';
                iStack_6f._2_1_ = ' ';
                iStack_6f._3_1_ = ' ';
                cStack_6b = '0';
                local_88._0_1_ = 'P';
                local_88._1_1_ = 'C';
                local_88._2_1_ = 'O';
                local_88._3_1_ = 'U';
                local_88._4_1_ = 'N';
                local_88._5_1_ = 'T';
                local_88._6_1_ = ' ';
                local_88._7_1_ = ' ';
                uStack_80 = 0x20202020203d;
                uStack_7a = 0x2020;
              }
              ffprec(fptr,(char *)&local_88,status);
            } while (iVar1 < local_94);
          }
          ffmrhd(local_a0,1,(int *)0x0,status);
          ffcrhd(fptr,status);
          iVar1 = *status;
        } while (iVar1 < 1);
      }
      if (iVar1 == 0x6b) {
        *status = 0;
      }
      ffclos(local_a0,status);
    }
    else {
      ffxmsg(2,(char *)&local_88);
      fits_execute_template(fptr,tempname,status);
    }
    ffmahd(fptr,1,(int *)0x0,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffoptplt(fitsfile *fptr,      /* O - FITS file pointer                   */
            const char *tempname, /* I - name of template file               */
            int *status)          /* IO - error status                       */
/*
  open template file and use it to create new file
*/
{
    fitsfile *tptr;
    int tstatus = 0, nkeys, nadd, ii;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (tempname == NULL || *tempname == '\0')     /* no template file? */
        return(*status);

    /* try opening template */
    ffopen(&tptr, (char *) tempname, READONLY, &tstatus); 

    if (tstatus)  /* not a FITS file, so treat it as an ASCII template */
    {
        ffxmsg(2, card);  /* clear the  error message */
        fits_execute_template(fptr, (char *) tempname, status);

        ffmahd(fptr, 1, 0, status);   /* move back to the primary array */
        return(*status);
    }
    else  /* template is a valid FITS file */
    {
        ffmahd(tptr, 1, NULL, status); /* make sure we are at the beginning */
        while (*status <= 0)
        {
           ffghsp(tptr, &nkeys, &nadd, status); /* get no. of keywords */

           for (ii = 1; ii <= nkeys; ii++)   /* copy keywords */
           {
              ffgrec(tptr,  ii, card, status);

              /* must reset the PCOUNT keyword to zero in the new output file */
              if (strncmp(card, "PCOUNT  ",8) == 0) { /* the PCOUNT keyword? */
	         if (strncmp(card+25, "    0", 5)) {  /* non-zero value? */
		    strncpy(card, "PCOUNT  =                    0", 30);
		 }
	      }   
 
              ffprec(fptr, card, status);
           }

           ffmrhd(tptr, 1, 0, status); /* move to next HDU until error */
           ffcrhd(fptr, status);  /* create empty new HDU in output file */
        }

        if (*status == END_OF_FILE)
        {
           *status = 0;              /* expected error condition */
        }
        ffclos(tptr, status);       /* close the template file */
    }

    ffmahd(fptr, 1, 0, status);   /* move to the primary array */
    return(*status);
}